

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

torrent_handle __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&>
          (session_handle *this,offset_in_session_impl_to_subr f,digest32<160L> *a)

{
  io_context *ctx;
  undefined8 uVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint *in_R8;
  torrent_handle tVar2;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::session_impl> s;
  bool local_a1;
  exception_ptr local_a0;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_98;
  exception_ptr local_88;
  type_conflict local_80;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_98);
  if (local_98._M_ptr == (session_impl *)0x0) {
    local_80.r = (torrent_handle *)CONCAT44(local_80.r._4_4_,0x73);
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&local_80);
  }
  local_80.done = &local_a1;
  local_a1 = false;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_impl).super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_80.ex = &local_a0;
  local_a0._M_exception_object = (void *)0x0;
  ctx = (local_98._M_ptr)->m_io_context;
  local_80.r = (torrent_handle *)this;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80.s.
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>,
             &local_98);
  local_80.a.m_number._M_elems._0_8_ = *(undefined8 *)in_R8;
  local_80.a.m_number._M_elems._8_8_ = *(undefined8 *)(in_R8 + 2);
  local_80.a.m_number._M_elems[4] = in_R8[4];
  local_80.f = (offset_in_session_impl_to_subr)a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<libtorrent::torrent_handle,libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&>(libtorrent::torrent_handle(libtorrent::aux::session_impl::*)(libtorrent::digest32<160l>const&),libtorrent::digest32<160l>const&)const::_lambda()_1_>
            (ctx,&local_80,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.s.
              super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  aux::torrent_wait(&local_a1,local_98._M_ptr);
  if (local_a0._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_a0);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (torrent_handle)
           tVar2.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_88,&local_a0);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_88);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_88);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_a0);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->m_impl).
              super___weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}